

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_exit_code(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 *extraout_RDX;
  undefined8 unaff_RBX;
  uv_stdio_container_t uStack_140;
  undefined4 uStack_130;
  undefined1 *puStack_128;
  undefined1 auStack_120 [264];
  undefined8 uStack_18;
  
  init_process_options("spawn_helper1",exit_cb);
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0016c685;
    if (exit_cb_called != 1) goto LAB_0016c68a;
    if (close_cb_called != 1) goto LAB_0016c68f;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_exit_code_cold_1();
LAB_0016c685:
    run_test_spawn_exit_code_cold_2();
LAB_0016c68a:
    run_test_spawn_exit_code_cold_3();
LAB_0016c68f:
    run_test_spawn_exit_code_cold_4();
  }
  run_test_spawn_exit_code_cold_5();
  uStack_18 = unaff_RBX;
  init_process_options("spawn_helper2",exit_cb);
  uVar2 = uv_default_loop();
  uv_pipe_init(uVar2,auStack_120,0);
  uStack_140.flags = UV_IGNORE;
  uStack_130 = 0x21;
  options.stdio_count = 2;
  options.stdio = &uStack_140;
  puStack_128 = auStack_120;
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if (iVar1 == 0) {
    iVar1 = uv_read_start(auStack_120,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_0016c7eb;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0016c7f0;
    if (exit_cb_called != 1) goto LAB_0016c7f5;
    if (close_cb_called != 2) goto LAB_0016c7fa;
    printf("output is: %s",output);
    if (CONCAT53(output._8_5_,output._5_3_) == 0xa646c726f7720 &&
        CONCAT35(output._5_3_,output._0_5_) == 0x6f77206f6c6c6568) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016c804;
    }
  }
  else {
    run_test_spawn_stdout_cold_1();
LAB_0016c7eb:
    run_test_spawn_stdout_cold_2();
LAB_0016c7f0:
    run_test_spawn_stdout_cold_3();
LAB_0016c7f5:
    run_test_spawn_stdout_cold_4();
LAB_0016c7fa:
    run_test_spawn_stdout_cold_5();
  }
  run_test_spawn_stdout_cold_6();
LAB_0016c804:
  run_test_spawn_stdout_cold_7();
  iVar1 = output_used;
  lVar3 = (long)output_used;
  *extraout_RDX = output + lVar3;
  extraout_RDX[1] = 0x400 - lVar3;
  return iVar1;
}

Assistant:

TEST_IMPL(spawn_exit_code) {
  int r;

  init_process_options("spawn_helper1", exit_cb);

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}